

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx512.cpp
# Opt level: O3

int __thiscall
ncnn::Convolution_x86_avx512::forward_int8_x86
          (Convolution_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined1 auVar1 [16];
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Layer *pLVar7;
  undefined1 auVar8 [32];
  _func_int ***__ptr;
  Option OVar9;
  int iVar10;
  int iVar11;
  Mat *pMVar12;
  long lVar13;
  long lVar14;
  undefined1 (*pauVar15) [64];
  undefined1 (*pauVar16) [64];
  ulong uVar17;
  undefined1 (*pauVar18) [32];
  undefined1 (*pauVar19) [32];
  undefined1 (*pauVar20) [16];
  undefined1 (*pauVar21) [16];
  ulong *puVar22;
  int *piVar23;
  ulong *puVar24;
  bool bVar25;
  int iVar26;
  uint uVar27;
  uint uVar28;
  int *piVar29;
  int iVar30;
  undefined4 uVar34;
  undefined1 (*pauVar31) [64];
  undefined1 (*pauVar32) [32];
  undefined1 (*pauVar33) [16];
  uint uVar35;
  int iVar36;
  ulong uVar37;
  Allocator **ppAVar38;
  int iVar39;
  int *piVar40;
  Option *opt_00;
  bool bVar41;
  int iVar42;
  uint uVar43;
  int iVar44;
  ulong uVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  undefined1 in_ZMM1 [64];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [32];
  int TILE_M;
  int TILE_N;
  int TILE_K;
  Mat m;
  Option opt_q;
  int in_stack_fffffffffffffa80;
  long local_538;
  long local_518;
  uint local_4f4;
  Mat local_4f0;
  Option *local_4a0;
  ulong local_498;
  long local_490;
  ulong local_488;
  ulong local_480;
  ulong local_478;
  int local_46c;
  int local_468;
  uint local_464;
  undefined8 local_460;
  Mat *local_458;
  ulong local_450;
  Allocator *local_448;
  int local_440;
  int local_43c;
  ulong local_438;
  ulong local_430;
  long local_428;
  Mat local_420;
  int local_3d4;
  Mat local_3d0;
  long local_388;
  Mat local_380;
  Mat local_338;
  Mat local_2f0;
  ulong local_2a0 [2];
  Allocator *local_290;
  ulong local_288;
  undefined1 local_280 [24];
  int iStack_268;
  Allocator *pAStack_260;
  int iStack_258;
  int iStack_254;
  int iStack_250;
  undefined8 uStack_24c;
  undefined1 auStack_264 [36];
  size_t local_240 [8];
  undefined1 local_200 [128];
  undefined1 local_180 [336];
  
  auVar46 = in_ZMM1._0_16_;
  local_2f0.elempack = bottom_blob->elempack;
  local_2f0.elemsize = bottom_blob->elemsize;
  piVar29 = bottom_blob->refcount;
  local_2f0.data = bottom_blob->data;
  local_2f0.refcount = bottom_blob->refcount;
  local_2f0.allocator = bottom_blob->allocator;
  local_2f0.dims = bottom_blob->dims;
  local_2f0.w = bottom_blob->w;
  local_2f0.h = bottom_blob->h;
  local_2f0.d = bottom_blob->d;
  local_2f0.c = bottom_blob->c;
  local_2f0.cstep = bottom_blob->cstep;
  if (piVar29 != (int *)0x0) {
    LOCK();
    *piVar29 = *piVar29 + 1;
    UNLOCK();
  }
  if (local_2f0.elempack == 0 || ((int)local_2f0.elemsize * 8) / local_2f0.elempack != 8) {
    auVar48 = vmovdqu64_avx512f((undefined1  [64])*opt);
    auVar48 = vmovdqa64_avx512f(auVar48);
    stack0xfffffffffffffd90 = auVar48._16_48_;
    local_280._0_8_ = auVar48._0_8_;
    local_280._8_8_ = opt->workspace_allocator;
    quantize_to_int8(bottom_blob,&local_2f0,&(this->super_Convolution).bottom_blob_int8_scales,
                     (Option *)local_280);
    if ((local_2f0.data == (void *)0x0) || ((long)local_2f0.c * local_2f0.cstep == 0)) {
      iVar36 = -100;
      goto LAB_00186417;
    }
  }
  local_380.cstep = 0;
  local_380.data = (void *)0x0;
  local_380.refcount._0_4_ = 0;
  local_380.refcount._4_4_ = 0;
  local_380.elemsize = 0;
  local_380.elempack = 0;
  local_380.allocator = (Allocator *)0x0;
  local_380.dims = 0;
  local_380.w = 0;
  local_380.h = 0;
  local_380.d = 0;
  local_380.c = 0;
  Convolution::make_padding(&this->super_Convolution,&local_2f0,&local_380,opt);
  iVar30 = local_380.c;
  iVar10 = local_380.elempack;
  if (local_380.data == (void *)0x0) {
    iVar36 = -100;
  }
  else {
    iVar36 = -100;
    if (local_380.cstep * (long)local_380.c != 0) {
      uVar35 = (this->super_Convolution).num_output;
      iVar26 = (~(((this->super_Convolution).kernel_w + -1) * (this->super_Convolution).dilation_w)
               + local_380.w) / (this->super_Convolution).stride_w + 1;
      iVar42 = (~(((this->super_Convolution).kernel_h + -1) * (this->super_Convolution).dilation_h)
               + local_380.h) / (this->super_Convolution).stride_h + 1;
      local_468 = (this->super_Convolution).int8_scale_term;
      uVar27 = 1;
      if (opt->use_packing_layout == true) {
        if (local_468 < 0x65) {
          if ((uVar35 & 0xf) == 0) {
            uVar27 = 0x10;
          }
          else if ((uVar35 & 7) == 0) {
            uVar27 = 8;
          }
          else {
            uVar27 = (uint)((uVar35 & 3) == 0) * 3 + 1;
          }
        }
        else {
          uVar27 = 1;
          if ((uVar35 & 7) == 0) {
            uVar27 = 8;
          }
        }
      }
      uVar43 = uVar27 * 4;
      if (100 < local_468) {
        uVar43 = uVar27;
      }
      local_4a0 = opt;
      local_458 = top_blob;
      Mat::create(top_blob,iVar26,iVar42,(int)uVar35 / (int)uVar27,(ulong)uVar43,uVar27,
                  opt->blob_allocator);
      opt_00 = local_4a0;
      if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
        iVar36 = 1;
        if (local_4a0->use_packing_layout == true) {
          uVar35 = (this->super_Convolution).num_output;
          if (local_468 < 0x65) {
            if ((uVar35 & 0xf) == 0) {
              iVar36 = 0x10;
            }
            else if ((uVar35 & 7) == 0) {
              iVar36 = 8;
            }
            else {
              iVar36 = (uint)((uVar35 & 3) == 0) * 3 + 1;
            }
          }
          else {
            iVar36 = 1;
            if ((uVar35 & 7) == 0) {
              iVar36 = 8;
            }
          }
        }
        if ((local_4a0->use_winograd23_convolution == false) &&
           (local_4a0->use_winograd43_convolution != true)) {
          bVar41 = false;
        }
        else {
          bVar41 = true;
          if (iVar10 * iVar30 < 9) {
            bVar41 = 8 < (this->super_Convolution).num_output;
          }
        }
        if ((local_4a0->use_packing_layout != false) &&
           ((auVar53._0_4_ = (this->super_Convolution).kernel_w,
            auVar53._4_4_ = (this->super_Convolution).kernel_h,
            auVar53._8_4_ = (this->super_Convolution).dilation_w,
            auVar53._12_4_ = (this->super_Convolution).dilation_h,
            ((this->super_Convolution).stride_w == 1 & local_4a0->use_winograd_convolution &
             (this->super_Convolution).stride_h == 1 & auVar53 == _DAT_005a6140 & bVar41) != 0 ||
            (local_4a0->use_sgemm_convolution == false)))) {
          iVar36 = (uint)(((this->super_Convolution).num_output & 3) == 0) * 3 + 1;
        }
        local_4f0.cstep = 0;
        local_4f0.data = (Allocator *)0x0;
        local_4f0.refcount._0_4_ = 0;
        local_4f0.refcount._4_4_ = 0;
        local_4f0.elemsize = 0;
        local_4f0.elempack = 0;
        local_4f0.allocator = (Allocator *)0x0;
        local_4f0.dims = 0;
        local_4f0.w = 0;
        local_4f0.h = 0;
        local_4f0.d = 0;
        local_4f0.c = 0;
        Mat::create(&local_4f0,iVar26,iVar42,(this->super_Convolution).num_output / iVar36,
                    (ulong)(uint)(iVar36 * 4),iVar36,local_4a0->workspace_allocator);
        iVar36 = -100;
        if (((Allocator *)local_4f0.data != (Allocator *)0x0) &&
           ((long)local_4f0.c * local_4f0.cstep != 0)) {
          iVar36 = this->nT;
          uVar34 = 0;
          iVar10 = iVar36;
          if (iVar36 == 0) {
            iVar10 = opt_00->num_threads;
          }
          if (opt_00->num_threads != iVar36 && iVar36 != 0) {
            uVar34 = 0;
            forward_int8_x86();
          }
          iVar36 = (this->super_Convolution).kernel_w;
          iVar30 = (this->super_Convolution).kernel_h;
          iVar26 = (this->super_Convolution).dilation_w;
          iVar42 = (this->super_Convolution).dilation_h;
          iVar39 = (this->super_Convolution).stride_w;
          iVar44 = (this->super_Convolution).stride_h;
          if (((iVar44 == 1 && (iVar39 == 1 && iVar42 == 1)) &
              (iVar26 == 1 && iVar30 == 3) & iVar36 == 3 & bVar41 & opt_00->use_winograd_convolution
              ) == 1) {
            if (((opt_00->use_winograd43_convolution == true) &&
                ((this->weight_winograd43_data).data != (void *)0x0)) &&
               ((long)(this->weight_winograd43_data).c * (this->weight_winograd43_data).cstep != 0))
            {
              iVar36 = conv3x3s1_winograd43_int8
                                 (&local_380,&local_4f0,&this->weight_winograd43_data,iVar10,opt_00)
              ;
            }
            else {
              iVar36 = cpu_support_x86_avx512_vnni();
              if (iVar36 == 0) {
                iVar36 = cpu_support_x86_avx_vnni();
                if (iVar36 == 0) {
                  auVar52._4_4_ = local_4f0.h;
                  auVar52._0_4_ = local_4f0.w;
                  auVar46 = vpcmpeqd_avx(auVar46,auVar46);
                  auVar52._8_8_ = 0;
                  auVar46 = vpsubd_avx(auVar52,auVar46);
                  auVar53 = vpsrld_avx(auVar46,0x1f);
                  auVar46 = vpaddd_avx(auVar46,auVar53);
                  auVar53 = vpsrad_avx(auVar46,1);
                  auVar46 = vpshufd_avx(auVar53,0x55);
                  auVar46 = vpmulld_avx(auVar46,auVar53);
                  uVar27 = local_4f0.elempack * local_4f0.c;
                  uVar45 = (ulong)uVar27;
                  local_460 = CONCAT44(uVar34,auVar46._0_4_);
                  uVar43 = local_380.elempack * local_380.c;
                  uVar17 = (ulong)uVar43;
                  get_optimal_tile_mnk_int8
                            (uVar27,auVar46._0_4_,uVar43,(int *)&local_4f4,(int *)&local_464,
                             &local_43c,iVar10);
                  iVar30 = local_43c;
                  uVar35 = local_464;
                  local_440 = (int)(uVar27 + local_4f4 + -1) / (int)local_4f4;
                  iVar36 = (int)((int)local_460 + local_464 + -1) / (int)local_464;
                  iVar26 = (int)(uVar43 + local_43c + -1) / local_43c;
                  iVar42 = local_43c * local_464;
                  local_3d0.cstep = 0;
                  local_3d0.data = (void *)0x0;
                  local_3d0.refcount._0_4_ = 0;
                  local_3d0.refcount._4_4_ = 0;
                  local_3d0.elemsize = 0;
                  local_3d0.elempack = 0;
                  local_3d0.allocator = (Allocator *)0x0;
                  local_3d0.dims = 0;
                  local_3d0.w = 0;
                  local_3d0.h = 0;
                  local_3d0.d = 0;
                  local_3d0.c = 0;
                  Mat::create(&local_3d0,iVar42,0x10,iVar26,iVar36,2,opt_00->workspace_allocator);
                  local_498 = uVar17;
                  local_2a0[0] = uVar45;
                  if ((local_3d0.data == (void *)0x0) || ((long)local_3d0.c * local_3d0.cstep == 0))
                  {
                    iVar36 = -100;
                  }
                  else {
                    uVar27 = iVar36 * iVar26;
                    iVar42 = iVar42 * 0x10;
                    uVar34 = auStack_264._32_4_;
                    if ((iVar10 < 2) || (iVar10 <= (int)uVar27)) {
                      local_240[0] = 0;
                      _local_280 = ZEXT1228((undefined1  [12])0x0);
                      _local_280 = ZEXT3260(_local_280);
                      _local_280 = (Option)CONCAT460(uVar34,_local_280);
                      Mat::create((Mat *)local_280,iVar42,1,iVar10,2,opt_00->workspace_allocator);
                      iVar36 = -100;
                      if (((_func_int ***)local_280._0_8_ != (_func_int ***)0x0) &&
                         ((long)(int)uStack_24c._4_4_ * local_240[0] != 0)) {
                        if (0 < (int)uVar27) {
                          uVar45 = 0;
                          do {
                            iVar36 = (int)uVar45 / iVar26;
                            uVar28 = (int)uVar45 % iVar26;
                            iVar39 = iVar36 * uVar35;
                            iVar42 = uVar28 * iVar30;
                            uVar43 = (int)local_460 - iVar39;
                            if ((int)uVar35 < (int)uVar43) {
                              uVar43 = uVar35;
                            }
                            iVar44 = (int)local_498 - iVar42;
                            if (iVar30 < iVar44) {
                              iVar44 = iVar30;
                            }
                            local_478 = uVar45;
                            iVar11 = get_omp_thread_num();
                            local_420.data =
                                 (void *)((long)(_func_int ***)local_280._0_8_ +
                                         (long)iVar11 * local_240[0] * local_280._16_8_);
                            local_420.refcount._0_4_ = 0;
                            local_420.refcount._4_4_ = 0;
                            local_420.elemsize = local_280._16_8_;
                            local_420.elempack = iStack_268;
                            local_420.allocator = pAStack_260;
                            local_420.w = iStack_254;
                            local_420.h = iStack_250;
                            local_420.d = 1;
                            local_420.c = (int)uStack_24c;
                            local_420.dims = iStack_258 + -1;
                            local_420.cstep =
                                 (local_280._16_8_ * (long)iStack_250 * (long)iStack_254 + 0xfU &
                                 0xfffffffffffffff0) / (ulong)local_280._16_8_;
                            if (iStack_258 == 4) {
                              local_420.cstep = (long)iStack_250 * (long)iStack_254;
                            }
                            conv3x3s1_winograd23_transform_input_tile_int8
                                      (&local_380,&local_420,iVar39,uVar43,iVar42,iVar44,
                                       in_stack_fffffffffffffa80);
                            local_338.cstep = (long)local_3d0.h * (long)local_3d0.w;
                            local_338.data =
                                 (void *)((long)local_3d0.data +
                                         uVar28 * local_3d0.elemsize * local_338.cstep +
                                         (long)iVar36 * local_3d0.cstep * local_3d0.elemsize);
                            local_338.refcount = (int *)0x0;
                            local_338.elemsize = local_3d0.elemsize;
                            local_338.elempack = local_3d0.elempack;
                            local_338.allocator = local_3d0.allocator;
                            local_338.dims = 2;
                            local_338.w = local_3d0.w;
                            local_338.h = local_3d0.h;
                            local_338.d = 1;
                            local_338.c = 1;
                            transpose_pack_B_tile_int8
                                      (&local_420,&local_338,0x10,uVar43,iVar44,(int)local_338.cstep
                                      );
                            uVar43 = (int)local_478 + 1;
                            uVar45 = (ulong)uVar43;
                          } while (uVar27 != uVar43);
                        }
                        if ((Allocator *)local_280._8_8_ != (Allocator *)0x0) {
                          LOCK();
                          *(int *)(_func_int ***)local_280._8_8_ =
                               *(int *)(_func_int ***)local_280._8_8_ + -1;
                          UNLOCK();
                          if (*(int *)(_func_int ***)local_280._8_8_ == 0) {
                            if (pAStack_260 == (Allocator *)0x0) goto joined_r0x00186561;
                            (*pAStack_260->_vptr_Allocator[3])();
                          }
                        }
                        goto LAB_0018656b;
                      }
                      if ((Allocator *)local_280._8_8_ != (Allocator *)0x0) {
                        LOCK();
                        *(int *)(_func_int ***)local_280._8_8_ =
                             *(int *)(_func_int ***)local_280._8_8_ + -1;
                        UNLOCK();
                        if (*(int *)(_func_int ***)local_280._8_8_ == 0) {
                          __ptr = (_func_int ***)local_280._0_8_;
                          if (pAStack_260 == (Allocator *)0x0) goto joined_r0x0018654c;
                          (*pAStack_260->_vptr_Allocator[3])();
                        }
                      }
                    }
                    else {
                      local_240[0] = 0;
                      _local_280 = ZEXT1228((undefined1  [12])0x0);
                      _local_280 = ZEXT3260(_local_280);
                      _local_280 = (Option)CONCAT460(uVar34,_local_280);
                      Mat::create((Mat *)local_280,iVar42,2,opt_00->workspace_allocator);
                      iVar36 = -100;
                      if (((_func_int ***)local_280._0_8_ == (_func_int ***)0x0) ||
                         ((long)(int)uStack_24c._4_4_ * local_240[0] == 0)) {
                        if ((Allocator *)local_280._8_8_ != (Allocator *)0x0) {
                          LOCK();
                          *(int *)(_func_int ***)local_280._8_8_ =
                               *(int *)(_func_int ***)local_280._8_8_ + -1;
                          UNLOCK();
                          if (*(int *)(_func_int ***)local_280._8_8_ == 0) {
                            __ptr = (_func_int ***)local_280._0_8_;
                            if (pAStack_260 == (Allocator *)0x0) goto joined_r0x0018654c;
                            (*pAStack_260->_vptr_Allocator[3])();
                          }
                        }
                      }
                      else {
                        if (0 < (int)uVar27) {
                          uVar43 = 0;
                          do {
                            iVar36 = ((int)uVar43 / iVar26) * uVar35;
                            iVar42 = (int)((long)(int)uVar43 % (long)iVar26) * iVar30;
                            uVar28 = (int)local_460 - iVar36;
                            if ((int)uVar35 < (int)uVar28) {
                              uVar28 = uVar35;
                            }
                            iVar39 = (int)local_498 - iVar42;
                            if (iVar30 < iVar39) {
                              iVar39 = iVar30;
                            }
                            conv3x3s1_winograd23_transform_input_tile_int8
                                      (&local_380,(Mat *)local_280,iVar36,uVar28,iVar42,iVar39,
                                       in_stack_fffffffffffffa80);
                            local_420.cstep = (long)local_3d0.h * (long)local_3d0.w;
                            local_420.data =
                                 (void *)((long)local_3d0.data +
                                         ((long)(int)uVar43 % (long)iVar26 & 0xffffffffU) *
                                         local_3d0.elemsize * local_420.cstep +
                                         (long)((int)uVar43 / iVar26) * local_3d0.cstep *
                                         local_3d0.elemsize);
                            local_420.refcount._0_4_ = 0;
                            local_420.refcount._4_4_ = 0;
                            local_420.elemsize = local_3d0.elemsize;
                            local_420.elempack = local_3d0.elempack;
                            local_420.allocator = local_3d0.allocator;
                            local_420.dims = 2;
                            local_420.w = local_3d0.w;
                            local_420.h = local_3d0.h;
                            local_420.d = 1;
                            local_420.c = 1;
                            transpose_pack_B_tile_int8
                                      ((Mat *)local_280,&local_420,0x10,uVar28,iVar39,
                                       (int)local_420.cstep);
                            uVar43 = uVar43 + 1;
                          } while (uVar27 != uVar43);
                        }
                        if ((Allocator *)local_280._8_8_ != (Allocator *)0x0) {
                          LOCK();
                          *(int *)(_func_int ***)local_280._8_8_ =
                               *(int *)(_func_int ***)local_280._8_8_ + -1;
                          UNLOCK();
                          if (*(int *)(_func_int ***)local_280._8_8_ == 0) {
                            if (pAStack_260 == (Allocator *)0x0) {
joined_r0x00186561:
                              if ((Allocator *)local_280._0_8_ != (Allocator *)0x0) {
                                free((void *)local_280._0_8_);
                              }
                            }
                            else {
                              (*pAStack_260->_vptr_Allocator[3])();
                            }
                          }
                        }
LAB_0018656b:
                        opt_00 = local_4a0;
                        uVar45 = (ulong)local_464;
                        local_420.cstep = 0;
                        local_420.data = (_func_int ***)0x0;
                        local_420.refcount._0_4_ = 0;
                        local_420.refcount._4_4_ = 0;
                        local_420.elemsize = 0;
                        local_420.elempack = 0;
                        local_420.allocator = (Allocator *)0x0;
                        local_420.dims = 0;
                        local_420.w = 0;
                        local_420.h = 0;
                        local_420.d = 0;
                        local_420.c = 0;
                        Mat::create(&local_420,local_4f4 * local_464 * 0x10,1,iVar10,4,
                                    local_4a0->workspace_allocator);
                        iVar36 = -100;
                        if (((_func_int ***)local_420.data != (_func_int ***)0x0) &&
                           ((long)local_420.c * local_420.cstep != 0)) {
                          if (0 < local_440) {
                            local_46c = 0;
                            do {
                              uVar27 = local_4f4;
                              iVar36 = get_omp_thread_num();
                              uVar43 = uVar27 * local_46c;
                              uVar35 = (int)local_2a0[0] - uVar43;
                              if ((int)uVar27 < (int)uVar35) {
                                uVar35 = uVar27;
                              }
                              if (0 < (int)local_460) {
                                pMVar12 = (Mat *)((long)local_420.data +
                                                 (long)iVar36 * local_420.cstep * local_420.elemsize
                                                 );
                                local_428 = (long)(int)uVar35;
                                local_388 = (long)(int)uVar43;
                                iVar36 = 0;
                                local_430 = (ulong)uVar43;
                                local_288 = (ulong)uVar35;
                                do {
                                  iVar10 = local_43c;
                                  uVar27 = (int)local_460 - iVar36;
                                  local_488 = (ulong)uVar27;
                                  if ((int)uVar45 < (int)uVar27) {
                                    local_488 = uVar45;
                                  }
                                  if (0 < (int)local_498) {
                                    iVar26 = (int)local_430;
                                    lVar14 = (long)(int)local_4f4;
                                    uVar17 = local_430 & 0xffffffff;
                                    uVar37 = local_498;
                                    iVar30 = 0;
                                    do {
                                      OVar9 = _local_280;
                                      iVar39 = (int)uVar37;
                                      iVar42 = iVar39;
                                      if (iVar10 < iVar39) {
                                        iVar42 = iVar10;
                                      }
                                      iVar44 = (this->weight_winograd23_data).w;
                                      iVar11 = (this->weight_winograd23_data).h;
                                      local_280._16_8_ = (this->weight_winograd23_data).elemsize;
                                      local_240[0] = (long)iVar11 * (long)iVar44;
                                      local_280._8_8_ = 0;
                                      local_280._0_8_ =
                                           (long)(this->weight_winograd23_data).data +
                                           local_280._16_8_ * local_240[0] * (long)(iVar30 / iVar10)
                                           + (this->weight_winograd23_data).cstep *
                                             (long)(int)((long)((ulong)(uint)(iVar26 >> 0x1f) <<
                                                                0x20 | uVar17) / lVar14) *
                                             local_280._16_8_;
                                      auStack_264 = OVar9._28_36_;
                                      iStack_268 = (this->weight_winograd23_data).elempack;
                                      pAStack_260 = (this->weight_winograd23_data).allocator;
                                      iStack_258 = 2;
                                      iStack_254._0_1_ = (bool)(char)iVar44;
                                      iStack_254._1_1_ = (bool)(char)((uint)iVar44 >> 8);
                                      iStack_254._2_1_ = (bool)(char)((uint)iVar44 >> 0x10);
                                      iStack_254._3_1_ = (bool)(char)((uint)iVar44 >> 0x18);
                                      iStack_250 = iVar11;
                                      auStack_264._32_4_ = OVar9._60_4_;
                                      uStack_24c._0_1_ = true;
                                      uStack_24c._1_1_ = false;
                                      uStack_24c._2_1_ = false;
                                      uStack_24c._3_1_ = false;
                                      uStack_24c._4_1_ = true;
                                      uStack_24c._5_1_ = false;
                                      uStack_24c._6_1_ = false;
                                      uStack_24c._7_1_ = false;
                                      local_338.cstep = (long)local_3d0.h * (long)local_3d0.w;
                                      local_338.data =
                                           (void *)((long)local_3d0.data +
                                                   local_338.cstep * local_3d0.elemsize *
                                                   (long)(iVar30 / iVar10) +
                                                   local_3d0.cstep * (long)(iVar36 / (int)uVar45) *
                                                   local_3d0.elemsize);
                                      local_338.refcount = (int *)0x0;
                                      local_338.elemsize = local_3d0.elemsize;
                                      local_338.elempack = local_3d0.elempack;
                                      local_338.allocator = local_3d0.allocator;
                                      local_338.dims = 2;
                                      local_338.w = local_3d0.w;
                                      uVar37 = (ulong)(uint)-(iVar10 - iVar39);
                                      local_338.h = local_3d0.h;
                                      local_338.d = 1;
                                      local_338.c = 1;
                                      iVar44 = iVar30 + iVar10;
                                      iVar39 = (int)local_498;
                                      gemm_transB_packed_tile_int8
                                                ((Mat *)local_280,&local_338,pMVar12,0x10,uVar35,
                                                 (int)local_488,iVar30,iVar42,iVar39 <= iVar44);
                                      iVar30 = iVar44;
                                    } while (iVar44 < iVar39);
                                  }
                                  iVar42 = (int)local_4f0.cstep * local_4f0.elempack;
                                  iVar10 = (local_4f0.w - (local_4f0.w + 1 >> 0x1f)) + 1 >> 1;
                                  local_478 = CONCAT44(local_478._4_4_,iVar10);
                                  iVar26 = (int)local_488;
                                  uVar27 = iVar26 * 0x10;
                                  local_438 = (ulong)uVar27;
                                  uVar45 = 0;
                                  local_490 = CONCAT44(local_490._4_4_,iVar42);
                                  iVar30 = (int)local_430;
                                  if (0xf < (int)uVar35) {
                                    auVar48 = vpbroadcastd_avx512f();
                                    auVar48 = vpmulld_avx512f(auVar48,_DAT_005a6940);
                                    lVar14 = (long)iVar42;
                                    local_480 = local_488 & 0xffffffff;
                                    local_448 = (Allocator *)0x0;
                                    local_450 = 0;
                                    do {
                                      if (0 < iVar26) {
                                        pauVar31 = (undefined1 (*) [64])
                                                   ((long)&pMVar12->data + (long)(int)local_448 * 4)
                                        ;
                                        uVar45 = 0;
                                        do {
                                          lVar13 = 0x100;
                                          pauVar15 = pauVar31;
                                          do {
                                            auVar49 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                                         (*pauVar15 +
                                                                         (long)(int)uVar27 * 4));
                                            auVar50 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                                         (*pauVar15 +
                                                                         (long)(iVar26 << 5) * 4));
                                            auVar51 = vpaddd_avx512f(auVar49,*pauVar15);
                                            auVar51 = vpaddd_avx512f(auVar51,auVar50);
                                            auVar49 = vpsubd_avx512f(auVar49,auVar50);
                                            auVar50 = vpaddd_avx512f(auVar49,*(undefined1 (*) [64])
                                                                              (*pauVar15 +
                                                                              (long)(iVar26 * 0x30)
                                                                              * 4));
                                            auVar49 = vmovdqa64_avx512f(auVar51);
                                            *(undefined1 (*) [64])((long)&local_380.data + lVar13) =
                                                 auVar49;
                                            auVar49 = vmovdqa64_avx512f(auVar50);
                                            *(undefined1 (*) [64])(local_280 + lVar13) = auVar49;
                                            lVar13 = lVar13 + 0x40;
                                            pauVar15 = (undefined1 (*) [64])
                                                       (*pauVar15 + (long)(iVar26 << 6) * 4);
                                          } while (lVar13 != 0x200);
                                          iVar44 = iVar36 + (int)uVar45;
                                          iVar39 = iVar44 % iVar10;
                                          uVar43 = (iVar44 / iVar10) * 2;
                                          pauVar15 = (undefined1 (*) [64])
                                                     ((long)(_func_int ***)local_4f0.data +
                                                     (long)(iVar39 * 2 * local_4f0.elempack) * 4 +
                                                     (long)local_4f0.w * local_4f0.elemsize *
                                                     (long)(int)uVar43 +
                                                     local_4f0.cstep *
                                                     (long)((iVar30 + (int)local_450) /
                                                           local_4f0.elempack) * local_4f0.elemsize)
                                          ;
                                          iVar39 = iVar39 * 2 + 1;
                                          uVar28 = 0;
                                          pauVar16 = (undefined1 (*) [64])local_280;
                                          bVar41 = true;
                                          do {
                                            bVar25 = bVar41;
                                            if ((int)(uVar28 | uVar43) < local_4f0.h) {
                                              auVar49 = vmovdqa64_avx512f(pauVar16[1]);
                                              auVar50 = vpaddd_avx512f(auVar49,*pauVar16);
                                              auVar51 = vmovdqa64_avx512f(pauVar16[2]);
                                              auVar49 = vpsubd_avx512f(auVar49,auVar51);
                                              auVar49 = vpaddd_avx512f(auVar49,pauVar16[3]);
                                              auVar50 = vpaddd_avx512f(auVar50,auVar51);
                                              auVar50 = vpsrad_avx512f(auVar50,2);
                                              auVar49 = vpsrad_avx512f(auVar49,2);
                                              if (local_4f0.elempack < 8) {
                                                if (local_4f0.elempack == 1) {
                                                  vpscatterdd_avx512f(ZEXT864(pauVar15) +
                                                                      auVar48 * (undefined1  [64])
                                                                                0x4,0xffff,auVar50);
                                                  if (iVar39 < local_4f0.w) {
                                                    vpscatterdd_avx512f(ZEXT864(pauVar15) +
                                                                        ZEXT864(4) +
                                                                        auVar48 * (undefined1  [64])
                                                                                  0x4,0xffff,auVar49
                                                                       );
                                                  }
                                                }
                                                else if (local_4f0.elempack == 4) {
                                                  *(undefined1 (*) [16])*pauVar15 = auVar50._0_16_;
                                                  auVar46 = vextracti32x4_avx512f(auVar50,1);
                                                  *(undefined1 (*) [16])(*pauVar15 + lVar14 * 4) =
                                                       auVar46;
                                                  auVar46 = vextracti32x4_avx512f(auVar50,2);
                                                  *(undefined1 (*) [16])
                                                   (*pauVar15 + (long)(iVar42 * 2) * 4) = auVar46;
                                                  auVar46 = vextracti32x4_avx512f(auVar50,3);
                                                  *(undefined1 (*) [16])
                                                   (*pauVar15 + (long)(iVar42 * 3) * 4) = auVar46;
                                                  if (iVar39 < local_4f0.w) {
                                                    *(undefined1 (*) [16])(*pauVar15 + 0x10) =
                                                         auVar49._0_16_;
                                                    auVar46 = vextracti32x4_avx512f(auVar49,1);
                                                    *(undefined1 (*) [16])
                                                     (*pauVar15 + lVar14 * 4 + 8) = auVar46;
                                                    auVar46 = vextracti32x4_avx512f(auVar49,2);
                                                    *(undefined1 (*) [16])
                                                     (*pauVar15 + (long)(iVar42 * 2) * 4 + 8) =
                                                         auVar46;
                                                    auVar46 = vextracti32x4_avx512f(auVar49,3);
                                                    *(undefined1 (*) [16])
                                                     (*pauVar15 + (long)(iVar42 * 3) * 4 + 8) =
                                                         auVar46;
                                                  }
                                                }
                                              }
                                              else if (local_4f0.elempack == 8) {
                                                *(undefined1 (*) [32])*pauVar15 = auVar50._0_32_;
                                                auVar47 = vextracti64x4_avx512f(auVar50,1);
                                                *(undefined1 (*) [32])(*pauVar15 + lVar14 * 4) =
                                                     auVar47;
                                                if (iVar39 < local_4f0.w) {
                                                  *(undefined1 (*) [32])(*pauVar15 + 0x20) =
                                                       auVar49._0_32_;
                                                  auVar47 = vextracti64x4_avx512f(auVar49,1);
                                                  *(undefined1 (*) [32])
                                                   (*pauVar15 + lVar14 * 4 + 0x10) = auVar47;
                                                }
                                              }
                                              else if (local_4f0.elempack == 0x10) {
                                                auVar50 = vmovdqa64_avx512f(auVar50);
                                                *pauVar15 = auVar50;
                                                if (iVar39 < local_4f0.w) {
                                                  auVar49 = vmovdqa64_avx512f(auVar49);
                                                  pauVar15[1] = auVar49;
                                                }
                                              }
                                              pauVar15 = (undefined1 (*) [64])
                                                         (*pauVar15 +
                                                         (long)(local_4f0.elempack * local_4f0.w) *
                                                         4);
                                            }
                                            uVar28 = 1;
                                            pauVar16 = (undefined1 (*) [64])local_180;
                                            bVar41 = false;
                                          } while (bVar25);
                                          uVar45 = uVar45 + 1;
                                          pauVar31 = pauVar31 + 1;
                                        } while (uVar45 != local_480);
                                      }
                                      uVar45 = local_450 + 0x10;
                                      uVar17 = local_450 + 0x1f;
                                      local_448 = (Allocator *)
                                                  (ulong)(uint)((int)local_448 + iVar26 * 0x100);
                                      local_450 = uVar45;
                                    } while (uVar17 < local_288);
                                  }
                                  uVar43 = (uint)uVar45;
                                  if ((int)(uVar43 | 7) < (int)uVar35) {
                                    auVar47 = vpbroadcastd_avx512vl();
                                    auVar47 = vpmulld_avx2(auVar47,_DAT_005a7c20);
                                    iVar39 = uVar43 * iVar26 * 0x10;
                                    local_480 = CONCAT44(local_480._4_4_,iVar26 * 0x80);
                                    local_518 = (long)(int)uVar43;
                                    do {
                                      if (0 < iVar26) {
                                        pauVar32 = (undefined1 (*) [32])
                                                   ((long)&pMVar12->data + (long)iVar39 * 4);
                                        uVar45 = 0;
                                        do {
                                          lVar14 = 0x80;
                                          pauVar18 = pauVar32;
                                          do {
                                            auVar56 = vpaddd_avx2(*(undefined1 (*) [32])
                                                                   (*pauVar18 +
                                                                   (long)(iVar26 * 8) * 4),*pauVar18
                                                                 );
                                            auVar56 = vpaddd_avx2(auVar56,*(undefined1 (*) [32])
                                                                           (*pauVar18 +
                                                                           (long)(int)uVar27 * 4));
                                            auVar8 = vpsubd_avx2(*(undefined1 (*) [32])
                                                                  (*pauVar18 +
                                                                  (long)(iVar26 * 8) * 4),
                                                                 *(undefined1 (*) [32])
                                                                  (*pauVar18 + (long)(int)uVar27 * 4
                                                                  ));
                                            auVar8 = vpaddd_avx2(auVar8,*(undefined1 (*) [32])
                                                                         (*pauVar18 +
                                                                         (long)(iVar26 * 0x18) * 4))
                                            ;
                                            *(undefined1 (*) [32])((long)&local_338.c + lVar14) =
                                                 auVar56;
                                            *(undefined1 (*) [32])(local_280 + lVar14) = auVar8;
                                            lVar14 = lVar14 + 0x20;
                                            pauVar18 = (undefined1 (*) [32])
                                                       (*pauVar18 + (long)(iVar26 << 5) * 4);
                                          } while (lVar14 != 0x100);
                                          iVar11 = iVar36 + (int)uVar45;
                                          iVar44 = iVar11 % iVar10;
                                          uVar43 = (iVar11 / iVar10) * 2;
                                          pauVar18 = (undefined1 (*) [32])
                                                     ((long)(_func_int ***)local_4f0.data +
                                                     (long)(iVar44 * 2 * local_4f0.elempack) * 4 +
                                                     (long)local_4f0.w * local_4f0.elemsize *
                                                     (long)(int)uVar43 +
                                                     local_4f0.cstep *
                                                     (long)((iVar30 + (int)local_518) /
                                                           local_4f0.elempack) * local_4f0.elemsize)
                                          ;
                                          iVar44 = iVar44 * 2 + 1;
                                          uVar28 = 0;
                                          pauVar19 = (undefined1 (*) [32])local_280;
                                          bVar41 = true;
                                          do {
                                            bVar25 = bVar41;
                                            if ((int)(uVar28 | uVar43) < local_4f0.h) {
                                              auVar56 = vpaddd_avx2(pauVar19[1],*pauVar19);
                                              auVar8 = vpsubd_avx2(pauVar19[1],pauVar19[2]);
                                              auVar8 = vpaddd_avx2(auVar8,pauVar19[3]);
                                              auVar56 = vpaddd_avx2(auVar56,pauVar19[2]);
                                              auVar59 = vpsrad_avx2(auVar56,2);
                                              auVar56 = vpsrad_avx2(auVar8,2);
                                              if (local_4f0.elempack == 1) {
                                                vpscatterdd_avx512vl
                                                          (ZEXT832(pauVar18) + ZEXT832(0) +
                                                           auVar47 * (undefined1  [32])0x4,0xffff,
                                                           auVar59);
                                                if (iVar44 < local_4f0.w) {
                                                  vpscatterdd_avx512vl
                                                            (ZEXT832(pauVar18) + ZEXT832(4) +
                                                             auVar47 * (undefined1  [32])0x4,0xffff,
                                                             auVar56);
                                                }
                                              }
                                              else if (local_4f0.elempack == 4) {
                                                *(undefined1 (*) [16])*pauVar18 = auVar59._0_16_;
                                                *(undefined1 (*) [16])(*pauVar18 + (long)iVar42 * 4)
                                                     = auVar59._16_16_;
                                                if (iVar44 < local_4f0.w) {
                                                  *(undefined1 (*) [16])(*pauVar18 + 0x10) =
                                                       auVar56._0_16_;
                                                  *(undefined1 (*) [16])
                                                   (*pauVar18 + (long)iVar42 * 4 + 0x10) =
                                                       auVar56._16_16_;
                                                }
                                              }
                                              else if ((local_4f0.elempack == 8) &&
                                                      (*pauVar18 = auVar59, iVar44 < local_4f0.w)) {
                                                pauVar18[1] = auVar56;
                                              }
                                              pauVar18 = (undefined1 (*) [32])
                                                         (*pauVar18 +
                                                         (long)(local_4f0.elempack * local_4f0.w) *
                                                         4);
                                            }
                                            uVar28 = 1;
                                            pauVar19 = (undefined1 (*) [32])local_200;
                                            bVar41 = false;
                                          } while (bVar25);
                                          uVar45 = uVar45 + 1;
                                          pauVar32 = pauVar32 + 1;
                                        } while (uVar45 != (local_488 & 0xffffffff));
                                      }
                                      lVar14 = local_518 + 8;
                                      lVar13 = local_518 + 0xf;
                                      iVar39 = iVar39 + iVar26 * 0x80;
                                      local_518 = lVar14;
                                    } while (lVar13 < local_428);
                                    uVar43 = (uint)lVar14;
                                  }
                                  if ((int)(uVar43 | 3) < (int)uVar35) {
                                    auVar46 = vpbroadcastd_avx512vl();
                                    auVar46 = vpmulld_avx(auVar46,_DAT_005a6250);
                                    iVar39 = uVar43 * iVar26 * 0x10;
                                    local_538 = (long)(int)uVar43;
                                    do {
                                      if (0 < iVar26) {
                                        pauVar33 = (undefined1 (*) [16])
                                                   ((long)&pMVar12->data + (long)iVar39 * 4);
                                        uVar45 = 0;
                                        do {
                                          lVar14 = 0x40;
                                          pauVar20 = pauVar33;
                                          do {
                                            auVar53 = vpaddd_avx(*(undefined1 (*) [16])
                                                                  (*pauVar20 +
                                                                  (long)(iVar26 * 4) * 4),*pauVar20)
                                            ;
                                            auVar53 = vpaddd_avx(auVar53,*(undefined1 (*) [16])
                                                                          (*pauVar20 +
                                                                          (long)(iVar26 * 8) * 4));
                                            auVar52 = vpsubd_avx(*(undefined1 (*) [16])
                                                                  (*pauVar20 +
                                                                  (long)(iVar26 * 4) * 4),
                                                                 *(undefined1 (*) [16])
                                                                  (*pauVar20 +
                                                                  (long)(iVar26 * 8) * 4));
                                            auVar52 = vpaddd_avx(auVar52,*(undefined1 (*) [16])
                                                                          (*pauVar20 +
                                                                          (long)(iVar26 * 0xc) * 4))
                                            ;
                                            *(undefined1 (*) [16])((long)&local_2f0.h + lVar14) =
                                                 auVar53;
                                            *(undefined1 (*) [16])(local_280 + lVar14) = auVar52;
                                            lVar14 = lVar14 + 0x10;
                                            pauVar20 = (undefined1 (*) [16])
                                                       (*pauVar20 + (long)(int)uVar27 * 4);
                                          } while (lVar14 != 0x80);
                                          iVar11 = iVar36 + (int)uVar45;
                                          iVar44 = iVar11 % iVar10;
                                          uVar43 = (iVar11 / iVar10) * 2;
                                          pauVar20 = (undefined1 (*) [16])
                                                     ((long)(_func_int ***)local_4f0.data +
                                                     (long)(iVar44 * 2 * local_4f0.elempack) * 4 +
                                                     (long)local_4f0.w * local_4f0.elemsize *
                                                     (long)(int)uVar43 +
                                                     local_4f0.cstep *
                                                     (long)((iVar30 + (int)local_538) /
                                                           local_4f0.elempack) * local_4f0.elemsize)
                                          ;
                                          iVar44 = iVar44 * 2 + 1;
                                          uVar28 = 0;
                                          pauVar21 = (undefined1 (*) [16])local_280;
                                          bVar41 = true;
                                          do {
                                            bVar25 = bVar41;
                                            if ((int)(uVar28 | uVar43) < local_4f0.h) {
                                              auVar53 = vpaddd_avx(pauVar21[1],*pauVar21);
                                              auVar52 = vpsubd_avx(pauVar21[1],pauVar21[2]);
                                              auVar52 = vpaddd_avx(auVar52,pauVar21[3]);
                                              auVar53 = vpaddd_avx(auVar53,pauVar21[2]);
                                              auVar57 = vpsrad_avx(auVar53,2);
                                              auVar53 = vpsrad_avx(auVar52,2);
                                              if (local_4f0.elempack == 1) {
                                                auVar1._8_8_ = 0;
                                                auVar1._0_8_ = pauVar20;
                                                vpscatterdd_avx512vl
                                                          (auVar1 + auVar46 * (undefined1  [16])0x4,
                                                           0xffff,auVar57);
                                                if (iVar44 < local_4f0.w) {
                                                  auVar57._8_8_ = 0;
                                                  auVar57._0_8_ = pauVar20;
                                                  vpscatterdd_avx512vl
                                                            (auVar57 + ZEXT816(4) +
                                                             auVar46 * (undefined1  [16])0x4,0xffff,
                                                             auVar53);
                                                }
                                              }
                                              else if ((local_4f0.elempack == 4) &&
                                                      (*pauVar20 = auVar57, iVar44 < local_4f0.w)) {
                                                pauVar20[1] = auVar53;
                                              }
                                              pauVar20 = (undefined1 (*) [16])
                                                         (*pauVar20 +
                                                         (long)(local_4f0.elempack * local_4f0.w) *
                                                         4);
                                            }
                                            uVar28 = 1;
                                            pauVar21 = (undefined1 (*) [16])local_240;
                                            bVar41 = false;
                                          } while (bVar25);
                                          uVar45 = uVar45 + 1;
                                          pauVar33 = pauVar33 + 1;
                                        } while (uVar45 != (local_488 & 0xffffffff));
                                      }
                                      lVar14 = local_538 + 4;
                                      lVar13 = local_538 + 7;
                                      iVar39 = iVar39 + iVar26 * 0x40;
                                      local_538 = lVar14;
                                    } while (lVar13 < local_428);
                                    uVar43 = (uint)lVar14;
                                  }
                                  if ((int)(uVar43 | 1) < (int)uVar35) {
                                    local_480 = (ulong)(iVar26 * 4);
                                    local_290 = (Allocator *)local_4f0.data;
                                    local_448 = (Allocator *)local_4f0.elemsize;
                                    local_2a0[1] = local_4f0.cstep * local_4f0.elemsize;
                                    local_450 = local_488 & 0xffffffff;
                                    iVar30 = uVar43 * iVar26 * 0x10;
                                    local_3d4 = iVar26 * 0x20;
                                    local_490 = (long)(int)uVar43;
                                    do {
                                      if (0 < iVar26) {
                                        puVar24 = (ulong *)((long)&pMVar12->data + (long)iVar30 * 4)
                                        ;
                                        uVar45 = 0;
                                        do {
                                          lVar14 = 4;
                                          puVar22 = puVar24;
                                          do {
                                            auVar46._8_8_ = 0;
                                            auVar46._0_8_ = *puVar22;
                                            auVar54._8_8_ = 0;
                                            auVar54._0_8_ =
                                                 *(ulong *)((long)puVar22 + (long)(iVar26 * 2) * 4);
                                            auVar46 = vpaddd_avx(auVar54,auVar46);
                                            auVar58._8_8_ = 0;
                                            auVar58._0_8_ =
                                                 *(ulong *)((long)puVar22 + local_480 * 4);
                                            auVar46 = vpaddd_avx(auVar46,auVar58);
                                            local_2a0[lVar14] = auVar46._0_8_;
                                            auVar46 = vpsubd_avx(auVar54,auVar58);
                                            auVar55._8_8_ = 0;
                                            auVar55._0_8_ =
                                                 *(ulong *)((long)puVar22 + (long)(iVar26 * 6) * 4);
                                            auVar46 = vpaddd_avx(auVar46,auVar55);
                                            *(long *)(local_280 + lVar14 * 8) = auVar46._0_8_;
                                            lVar14 = lVar14 + 1;
                                            puVar22 = (ulong *)((long)puVar22 +
                                                               (long)(iVar26 * 8) * 4);
                                          } while (lVar14 != 8);
                                          iVar44 = iVar36 + (int)uVar45;
                                          iVar39 = iVar44 % iVar10;
                                          uVar43 = (iVar44 / iVar10) * 2;
                                          piVar29 = (int *)((long)(_func_int ***)local_4f0.data +
                                                           (long)(iVar39 * 2) * 4 +
                                                           (long)local_4f0.w * local_4f0.elemsize *
                                                           (long)(int)uVar43 +
                                                           (local_388 + local_490) * local_2a0[1]);
                                          uVar28 = 0;
                                          ppAVar38 = (Allocator **)local_280;
                                          bVar41 = true;
                                          do {
                                            bVar25 = bVar41;
                                            if ((int)(uVar28 | uVar43) < local_4f0.h) {
                                              iVar44 = *(int *)(ppAVar38 + 1);
                                              iVar11 = *(int *)((long)ppAVar38 + 0xc);
                                              iVar2 = *(int *)(ppAVar38 + 2);
                                              iVar3 = *(int *)((long)ppAVar38 + 4);
                                              iVar4 = *(int *)((long)ppAVar38 + 0x14);
                                              iVar5 = *(int *)(ppAVar38 + 3);
                                              iVar6 = *(int *)((long)ppAVar38 + 0x1c);
                                              *piVar29 = *(int *)ppAVar38 + iVar44 + iVar2 >> 2;
                                              piVar29[iVar42] = iVar3 + iVar11 + iVar4 >> 2;
                                              if (iVar39 * 2 + 1 < local_4f0.w) {
                                                piVar29[1] = (iVar44 - iVar2) + iVar5 >> 2;
                                                piVar29[(long)iVar42 + 1] =
                                                     (iVar11 - iVar4) + iVar6 >> 2;
                                              }
                                              piVar29 = piVar29 + local_4f0.w;
                                            }
                                            uVar28 = 1;
                                            ppAVar38 = &pAStack_260;
                                            bVar41 = false;
                                          } while (bVar25);
                                          uVar45 = uVar45 + 1;
                                          puVar24 = puVar24 + 1;
                                        } while (uVar45 != local_450);
                                      }
                                      lVar14 = local_490 + 2;
                                      lVar13 = local_490 + 3;
                                      iVar30 = iVar30 + local_3d4;
                                      local_490 = lVar14;
                                    } while (lVar13 < local_428);
                                    uVar43 = (uint)lVar14;
                                  }
                                  if ((int)uVar43 < (int)uVar35) {
                                    local_480 = local_4f0.cstep * local_4f0.elemsize;
                                    local_538 = (long)(int)uVar43;
                                    iVar30 = uVar43 * iVar26 * 0x10;
                                    do {
                                      if (0 < iVar26) {
                                        piVar29 = (int *)((long)&pMVar12->data + (long)iVar30 * 4);
                                        uVar45 = 0;
                                        do {
                                          lVar14 = 4;
                                          piVar40 = (int *)local_280;
                                          piVar23 = piVar29;
                                          do {
                                            iVar42 = piVar23[iVar26];
                                            iVar39 = piVar23[iVar26 * 2];
                                            *(int *)((long)&local_290 + lVar14 * 4) =
                                                 *piVar23 + iVar42 + iVar39;
                                            *(int *)(local_280 + lVar14 * 4) =
                                                 (iVar42 - iVar39) + piVar23[iVar26 * 3];
                                            lVar14 = lVar14 + 1;
                                            piVar23 = piVar23 + iVar26 * 4;
                                          } while (lVar14 != 8);
                                          iVar39 = iVar36 + (int)uVar45;
                                          iVar42 = iVar39 % iVar10;
                                          uVar43 = (iVar39 / iVar10) * 2;
                                          piVar23 = (int *)((long)(_func_int ***)local_4f0.data +
                                                           (long)(iVar42 * 2) * 4 +
                                                           (long)local_4f0.w * local_4f0.elemsize *
                                                           (long)(int)uVar43 +
                                                           (local_388 + local_538) * local_480);
                                          uVar28 = 0;
                                          bVar41 = true;
                                          do {
                                            bVar25 = bVar41;
                                            if ((int)(uVar28 | uVar43) < local_4f0.h) {
                                              iVar39 = piVar40[1];
                                              iVar44 = piVar40[2];
                                              iVar11 = piVar40[3];
                                              *piVar23 = *piVar40 + iVar39 + iVar44 >> 2;
                                              if (iVar42 * 2 + 1 < local_4f0.w) {
                                                piVar23[1] = (iVar39 - iVar44) + iVar11 >> 2;
                                              }
                                              piVar23 = piVar23 + local_4f0.w;
                                            }
                                            uVar28 = 1;
                                            piVar40 = (int *)(local_280 + 0x10);
                                            bVar41 = false;
                                          } while (bVar25);
                                          uVar45 = uVar45 + 1;
                                          piVar29 = piVar29 + 1;
                                        } while (uVar45 != (local_488 & 0xffffffff));
                                      }
                                      local_538 = local_538 + 1;
                                      iVar30 = iVar30 + uVar27;
                                    } while (local_538 != local_428);
                                  }
                                  uVar45 = (ulong)local_464;
                                  iVar36 = iVar36 + local_464;
                                } while (iVar36 < (int)local_460);
                              }
                              local_46c = local_46c + 1;
                              opt_00 = local_4a0;
                            } while (local_46c != local_440);
                          }
                          iVar36 = 0;
                        }
                        piVar29 = (int *)CONCAT44(local_420.refcount._4_4_,local_420.refcount._0_4_)
                        ;
                        if (piVar29 != (int *)0x0) {
                          LOCK();
                          *piVar29 = *piVar29 + -1;
                          UNLOCK();
                          if (*piVar29 == 0) {
                            __ptr = (_func_int ***)local_420.data;
                            if (local_420.allocator == (Allocator *)0x0) {
joined_r0x0018654c:
                              if (__ptr != (_func_int ***)0x0) {
                                free(__ptr);
                              }
                            }
                            else {
                              (*(local_420.allocator)->_vptr_Allocator[3])();
                            }
                          }
                        }
                      }
                    }
                  }
                  piVar29 = (int *)CONCAT44(local_3d0.refcount._4_4_,local_3d0.refcount._0_4_);
                  if (piVar29 != (int *)0x0) {
                    LOCK();
                    *piVar29 = *piVar29 + -1;
                    UNLOCK();
                    if (*piVar29 == 0) {
                      if (local_3d0.allocator == (Allocator *)0x0) {
                        if (local_3d0.data != (void *)0x0) {
                          free(local_3d0.data);
                        }
                      }
                      else {
                        (*(local_3d0.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                }
                else {
                  iVar36 = conv3x3s1_winograd23_int8_avxvnni
                                     (&local_380,&local_4f0,&this->weight_winograd23_data,iVar10,
                                      opt_00);
                }
              }
              else {
                iVar36 = conv3x3s1_winograd23_int8_avx512vnni
                                   (&local_380,&local_4f0,&this->weight_winograd23_data,iVar10,
                                    opt_00);
              }
            }
LAB_0018579a:
            if (iVar36 != 0) goto LAB_00186393;
          }
          else {
            if (opt_00->use_sgemm_convolution == true) {
              iVar36 = convolution_im2col_gemm_int8
                                 (&local_380,&local_4f0,&this->weight_sgemm_data,iVar36,iVar30,
                                  iVar26,iVar42,iVar39,iVar44,iVar10,opt_00);
              goto LAB_0018579a;
            }
            convolution_packed_int8
                      (&local_380,&local_4f0,&this->weight_data_tm,iVar36,iVar30,iVar26,iVar42,
                       iVar39,iVar44,opt_00);
          }
          pMVar12 = local_458;
          if (opt_00->use_packing_layout == true) {
            uVar34 = auStack_264._32_4_;
            if (100 < local_468) {
              if (local_4f0.elempack == 4) {
                if ((local_4f0.c & 0x80000001U) == 1) {
                  local_240[0] = 0;
                  _local_280 = ZEXT1228((undefined1  [12])0x0);
                  _local_280 = ZEXT3260(_local_280);
                  _local_280 = (Option)CONCAT460(uVar34,_local_280);
                  convert_packing(&local_4f0,(Mat *)local_280,1,opt_00);
                  if ((Allocator *)local_280._8_8_ != (Allocator *)0x0) {
                    LOCK();
                    *(int *)(_func_int ***)local_280._8_8_ =
                         *(int *)(_func_int ***)local_280._8_8_ + 1;
                    UNLOCK();
                  }
                  piVar29 = (int *)CONCAT44(local_4f0.refcount._4_4_,local_4f0.refcount._0_4_);
                  if (piVar29 != (int *)0x0) {
                    LOCK();
                    *piVar29 = *piVar29 + -1;
                    UNLOCK();
                    if (*piVar29 == 0) {
                      if (local_4f0.allocator == (Allocator *)0x0) {
                        if ((Allocator *)local_4f0.data != (Allocator *)0x0) {
                          free(local_4f0.data);
                        }
                      }
                      else {
                        (*(local_4f0.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                  local_4f0.data = (void *)local_280._0_8_;
                  local_4f0.refcount._0_4_ = local_280._8_4_;
                  local_4f0.refcount._4_4_ = local_280._12_4_;
                  local_4f0.elemsize = local_280._16_8_;
                  local_4f0.elempack = iStack_268;
                  local_4f0.allocator = pAStack_260;
                  local_4f0.dims = local_280._40_4_;
                  local_4f0.w = local_280._44_4_;
                  local_4f0.h = local_280._48_4_;
                  local_4f0.d = local_280._52_4_;
                  local_4f0.c = uStack_24c._4_4_;
                  local_4f0.cstep = local_240[0];
                  if ((Allocator *)local_280._8_8_ != (Allocator *)0x0) {
                    LOCK();
                    *(int *)(_func_int ***)local_280._8_8_ =
                         *(int *)(_func_int ***)local_280._8_8_ + -1;
                    UNLOCK();
                    if (*(int *)(_func_int ***)local_280._8_8_ == 0) {
                      if (pAStack_260 == (Allocator *)0x0) {
                        if ((Allocator *)local_280._0_8_ != (Allocator *)0x0) {
                          free((void *)local_280._0_8_);
                        }
                      }
                      else {
                        (*pAStack_260->_vptr_Allocator[3])();
                      }
                    }
                  }
                  if (local_4f0.elempack != 4) goto LAB_00185896;
                }
                OVar9 = _local_280;
                if ((local_4f0.c & 1U) == 0) {
                  local_240[0] = 0;
                  _local_280 = ZEXT1228((undefined1  [12])0x0);
                  auStack_264._32_4_ = OVar9._60_4_;
                  _local_280 = ZEXT3260(_local_280);
                  convert_packing(&local_4f0,(Mat *)local_280,8,opt_00);
                  if ((Allocator *)local_280._8_8_ != (Allocator *)0x0) {
                    LOCK();
                    *(int *)(_func_int ***)local_280._8_8_ =
                         *(int *)(_func_int ***)local_280._8_8_ + 1;
                    UNLOCK();
                  }
                  piVar29 = (int *)CONCAT44(local_4f0.refcount._4_4_,local_4f0.refcount._0_4_);
                  if (piVar29 != (int *)0x0) {
                    LOCK();
                    *piVar29 = *piVar29 + -1;
                    UNLOCK();
                    if (*piVar29 == 0) {
                      if (local_4f0.allocator == (Allocator *)0x0) {
                        if ((Allocator *)local_4f0.data != (Allocator *)0x0) {
                          free(local_4f0.data);
                        }
                      }
                      else {
                        (*(local_4f0.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                  local_4f0.data = (void *)local_280._0_8_;
                  local_4f0.refcount._0_4_ = local_280._8_4_;
                  local_4f0.refcount._4_4_ = local_280._12_4_;
                  local_4f0.elemsize = local_280._16_8_;
                  local_4f0.elempack = iStack_268;
                  local_4f0.allocator = pAStack_260;
                  local_4f0.dims = local_280._40_4_;
                  local_4f0.w = local_280._44_4_;
                  local_4f0.h = local_280._48_4_;
                  local_4f0.d = local_280._52_4_;
                  local_4f0.c = uStack_24c._4_4_;
                  local_4f0.cstep = local_240[0];
                  if ((Allocator *)local_280._8_8_ != (Allocator *)0x0) {
                    LOCK();
                    *(int *)(_func_int ***)local_280._8_8_ =
                         *(int *)(_func_int ***)local_280._8_8_ + -1;
                    UNLOCK();
                    if (*(int *)(_func_int ***)local_280._8_8_ == 0) {
                      if (pAStack_260 == (Allocator *)0x0) {
                        if ((Allocator *)local_280._0_8_ != (Allocator *)0x0) {
                          free((void *)local_280._0_8_);
                        }
                      }
                      else {
                        (*pAStack_260->_vptr_Allocator[3])();
                      }
                    }
                  }
                }
              }
LAB_00185896:
              iVar36 = 0;
              requantize_from_int32_to_int8
                        (&local_4f0,pMVar12,&this->scale_in_data,
                         &(this->super_Convolution).top_blob_int8_scales,
                         &(this->super_Convolution).bias_data,
                         (this->super_Convolution).activation_type,
                         &(this->super_Convolution).activation_params,opt_00);
              goto LAB_00186393;
            }
            if ((local_4f0.elempack == 4) && ((local_4f0.c & 1U) == 0)) {
              local_240[0] = 0;
              _local_280 = ZEXT1228((undefined1  [12])0x0);
              _local_280 = ZEXT3260(_local_280);
              _local_280 = (Option)CONCAT460(uVar34,_local_280);
              convert_packing(&local_4f0,(Mat *)local_280,8,opt_00);
              if ((Allocator *)local_280._8_8_ != (Allocator *)0x0) {
                LOCK();
                *(int *)(_func_int ***)local_280._8_8_ = *(int *)(_func_int ***)local_280._8_8_ + 1;
                UNLOCK();
              }
              piVar29 = (int *)CONCAT44(local_4f0.refcount._4_4_,local_4f0.refcount._0_4_);
              if (piVar29 != (int *)0x0) {
                LOCK();
                *piVar29 = *piVar29 + -1;
                UNLOCK();
                if (*piVar29 == 0) {
                  if (local_4f0.allocator == (Allocator *)0x0) {
                    if ((Allocator *)local_4f0.data != (Allocator *)0x0) {
                      free(local_4f0.data);
                    }
                  }
                  else {
                    (*(local_4f0.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              local_4f0.data = (void *)local_280._0_8_;
              local_4f0.refcount._0_4_ = local_280._8_4_;
              local_4f0.refcount._4_4_ = local_280._12_4_;
              local_4f0.elemsize = local_280._16_8_;
              local_4f0.elempack = iStack_268;
              local_4f0.allocator = pAStack_260;
              local_4f0.dims = local_280._40_4_;
              local_4f0.w = local_280._44_4_;
              local_4f0.h = local_280._48_4_;
              local_4f0.d = local_280._52_4_;
              local_4f0.c = uStack_24c._4_4_;
              local_4f0.cstep = local_240[0];
              if ((Allocator *)local_280._8_8_ != (Allocator *)0x0) {
                LOCK();
                *(int *)(_func_int ***)local_280._8_8_ = *(int *)(_func_int ***)local_280._8_8_ + -1
                ;
                UNLOCK();
                if (*(int *)(_func_int ***)local_280._8_8_ == 0) {
                  if (pAStack_260 == (Allocator *)0x0) {
                    if ((Allocator *)local_280._0_8_ != (Allocator *)0x0) {
                      free((void *)local_280._0_8_);
                    }
                  }
                  else {
                    (*pAStack_260->_vptr_Allocator[3])();
                  }
                }
              }
            }
          }
          else if (100 < local_468) goto LAB_00185896;
          dequantize_from_int32
                    (&local_4f0,pMVar12,&this->scale_in_data,&(this->super_Convolution).bias_data,
                     opt_00);
          pLVar7 = this->activation;
          iVar36 = 0;
          if (pLVar7 != (Layer *)0x0) {
            (*pLVar7->_vptr_Layer[9])(pLVar7,local_458,opt_00);
          }
        }
LAB_00186393:
        piVar29 = (int *)CONCAT44(local_4f0.refcount._4_4_,local_4f0.refcount._0_4_);
        if (piVar29 != (int *)0x0) {
          LOCK();
          *piVar29 = *piVar29 + -1;
          UNLOCK();
          if (*piVar29 == 0) {
            if (local_4f0.allocator == (Allocator *)0x0) {
              if ((Allocator *)local_4f0.data != (Allocator *)0x0) {
                free(local_4f0.data);
              }
            }
            else {
              (*(local_4f0.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
    }
  }
  piVar29 = (int *)CONCAT44(local_380.refcount._4_4_,local_380.refcount._0_4_);
  if (piVar29 != (int *)0x0) {
    LOCK();
    *piVar29 = *piVar29 + -1;
    UNLOCK();
    if (*piVar29 == 0) {
      if (local_380.allocator == (Allocator *)0x0) {
        if (local_380.data != (void *)0x0) {
          free(local_380.data);
        }
      }
      else {
        (*(local_380.allocator)->_vptr_Allocator[3])();
      }
    }
  }
LAB_00186417:
  if (local_2f0.refcount != (int *)0x0) {
    LOCK();
    *local_2f0.refcount = *local_2f0.refcount + -1;
    UNLOCK();
    if (*local_2f0.refcount == 0) {
      if (local_2f0.allocator == (Allocator *)0x0) {
        if (local_2f0.data != (void *)0x0) {
          free(local_2f0.data);
        }
      }
      else {
        (*(local_2f0.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar36;
}

Assistant:

int Convolution_x86_avx512::forward_int8_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int elembits = bottom_blob.elembits();

    Mat bottom_blob_int8 = bottom_blob;
    if (elembits != 8)
    {
        Option opt_q = opt;
        opt_q.blob_allocator = opt.workspace_allocator;
        quantize_to_int8(bottom_blob, bottom_blob_int8, bottom_blob_int8_scales, opt_q);
        if (bottom_blob_int8.empty())
            return -100;
    }

    //     NCNN_LOGE("Convolution_x86_avx512 input %d x %d  ksize=%d %d  stride=%d %d", w, h, kernel_w, kernel_h, stride_w, stride_h);

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_int8, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    int w = bottom_blob_bordered.w;
    int h = bottom_blob_bordered.h;
    int channels = bottom_blob_bordered.c;
    int elempack = bottom_blob_bordered.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    bool use_int8_requantize = int8_scale_term > 100;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        if (use_int8_requantize)
            out_elempack = num_output % 8 == 0 ? 8 : 1;
        else
        {
#if __AVX512F__
            out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
            out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
            out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
        }
    }
#endif // __SSE2__
    size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

    //     NCNN_LOGE("forward_int8_x86 %d %d %d    %d %d", w, h, bottom_blob_bordered.c, elempack, out_elempack);

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    const int num_input = channels * elempack;

    int out_elempack_int32 = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        if (use_int8_requantize)
        {
#if __AVX__
            out_elempack_int32 = num_output % 8 == 0 ? 8 : 1;
#else
            out_elempack_int32 = num_output % 4 == 0 ? 4 : 1;
#endif
        }
        else
        {
#if __AVX512F__
            out_elempack_int32 = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
            out_elempack_int32 = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
            out_elempack_int32 = num_output % 4 == 0 ? 4 : 1;
#endif
        }
    }
#endif // __SSE2__

    bool prefer_winograd = (opt.use_winograd23_convolution || opt.use_winograd43_convolution) && (num_input > 8 || num_output > 8);

#if __SSE2__
    if (opt.use_packing_layout)
    {
        if ((opt.use_winograd_convolution && prefer_winograd && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1) || (!opt.use_sgemm_convolution))
        {
            // TODO implement winograd and packed int8 avx pack8 output
            out_elempack_int32 = num_output % 4 == 0 ? 4 : 1;
        }
    }
#endif // __SSE2__

    Mat top_blob_int32;
    top_blob_int32.create(outw, outh, num_output / out_elempack_int32, (size_t)(4u * out_elempack_int32), out_elempack_int32, opt.workspace_allocator);
    if (top_blob_int32.empty())
        return -100;

    int _nT = nT ? nT : opt.num_threads;
    if (nT != 0 && opt.num_threads != nT)
    {
        // force num_threads the same as in create_pipeline
        // so we could use pre-packed A/B from the same tile config
        NCNN_LOGE("opt.num_threads %d changed, convolution gemm will use load-time value %d", opt.num_threads, nT);
    }

    int ret = 0;
    if (opt.use_winograd_convolution && prefer_winograd && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
    {
        if (opt.use_winograd43_convolution && !weight_winograd43_data.empty())
            ret = conv3x3s1_winograd43_int8(bottom_blob_bordered, top_blob_int32, weight_winograd43_data, _nT, opt);
        else
            ret = conv3x3s1_winograd23_int8(bottom_blob_bordered, top_blob_int32, weight_winograd23_data, _nT, opt);
    }
    else if (opt.use_sgemm_convolution)
    {
        ret = convolution_im2col_gemm_int8(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, _nT, opt);
    }
    else
    {
        convolution_packed_int8(bottom_blob_bordered, top_blob_int32, weight_data_tm, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
    }
    if (ret != 0)
        return ret;

#if __SSE2__
    if (opt.use_packing_layout)
    {
        // NCNN_LOGE("top_blob_int32  %d  %d", top_blob_int32.c, top_blob_int32.elempack);
        if (use_int8_requantize)
        {
            // TODO implement winograd and packed int8 pack1 output
            if (top_blob_int32.elempack == 4 && top_blob_int32.c % 2 == 1)
            {
                Mat tmp;
                convert_packing(top_blob_int32, tmp, 1, opt);
                top_blob_int32 = tmp;
            }
            if (top_blob_int32.elempack == 4 && top_blob_int32.c % 2 == 0)
            {
                Mat tmp;
                convert_packing(top_blob_int32, tmp, 8, opt);
                top_blob_int32 = tmp;
            }
        }
        else
        {
#if __AVX__
            // TODO implement winograd and packed int8 avx pack8 output
            if (top_blob_int32.elempack == 4 && top_blob_int32.c % 2 == 0)
            {
                Mat tmp;
                convert_packing(top_blob_int32, tmp, 8, opt);
                top_blob_int32 = tmp;
            }
#endif // __AVX__
        }
    }
#endif

    if (use_int8_requantize)
    {
        requantize_from_int32_to_int8(top_blob_int32, top_blob, scale_in_data, top_blob_int8_scales, bias_data, activation_type, activation_params, opt);
    }
    else
    {
        dequantize_from_int32(top_blob_int32, top_blob, scale_in_data, bias_data, opt);

        if (activation)
        {
            activation->forward_inplace(top_blob, opt);
        }
    }

    return 0;
}